

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RootObjectBase.cpp
# Opt level: O3

BOOL __thiscall Js::RootObjectBase::EnsureProperty(RootObjectBase *this,PropertyId propertyId)

{
  BOOL BVar1;
  
  BVar1 = HasOwnPropertyCheckNoRedecl(this,propertyId);
  if (BVar1 == 0) {
    (*(this->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
      super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x1a])
              (this,propertyId,
               (((((this->super_DynamicObject).super_RecyclableObject.type.ptr)->javascriptLibrary).
                ptr)->super_JavascriptLibraryBase).undefinedValue.ptr,0x30,0);
  }
  return 1;
}

Assistant:

BOOL
    RootObjectBase::EnsureProperty(PropertyId propertyId)
    {
        if (!RootObjectBase::HasOwnPropertyCheckNoRedecl(propertyId))
        {
            this->InitProperty(propertyId, this->GetLibrary()->GetUndefined(),
                static_cast<Js::PropertyOperationFlags>(PropertyOperation_PreInit | PropertyOperation_SpecialValue));
        }
        return true;
    }